

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O2

void __thiscall
solitaire::piles::TableauPile::initialize
          (TableauPile *this,const_iterator *begin,const_iterator *end)

{
  pointer pCVar1;
  pointer pCVar2;
  uint uVar3;
  
  std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>::
  _M_assign_aux<solitaire::cards::Card_const*>
            ((vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>> *)&this->cards,
             *begin,*end);
  pCVar1 = (this->cards).
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (this->cards).
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  if (pCVar1 != pCVar2) {
    uVar3 = (int)((ulong)((long)pCVar1 - (long)pCVar2) >> 3) - 1;
  }
  this->topCoveredCardPosition = uVar3;
  return;
}

Assistant:

void TableauPile::initialize(const Deck::const_iterator& begin,
                             const Deck::const_iterator& end) {
    cards.assign(begin, end);
    topCoveredCardPosition = cards.empty() ? 0 : cards.size() - 1;
}